

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_data(basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *dat)

{
  pointer __p;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  __ptr;
  pointer __p_00;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
  _Var2;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
  __ptr_00;
  _Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  _Var3;
  _Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  __ptr_01;
  pointer __p_1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
  *this_01;
  unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  
  this->type_ = dat->type_;
  (this->obj_)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_false>
  ._M_head_impl =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *)0x0;
  (this->str_)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->list_)._M_t.
  super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  (this->partial_)._M_t.
  super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
  .
  super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
  ._M_head_impl =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        *)0x0;
  (this->lambda_)._M_t.
  super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  __p = (dat->obj_)._M_t.
        super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_false>
        ._M_head_impl;
  if (__p == (pointer)0x0) {
    _Var1._M_head_impl =
         (dat->str_)._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (_Var1._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __p_00 = (dat->list_)._M_t.
               super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
               ._M_head_impl;
      if (__p_00 == (pointer)0x0) {
        _Var2._M_head_impl =
             (dat->partial_)._M_t.
             super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
             .
             super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
             ._M_head_impl;
        if (_Var2._M_head_impl ==
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x0) {
          _Var3._M_head_impl =
               (dat->lambda_)._M_t.
               super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
               ._M_head_impl;
          if (_Var3._M_head_impl !=
              (basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            this_02 = &this->lambda_;
            (dat->lambda_)._M_t.
            super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl =
                 (basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
            __ptr_01._M_head_impl =
                 (this_02->_M_t).
                 super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                 ._M_head_impl;
            (this_02->_M_t).
            super___uniq_ptr_impl<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Head_base<0UL,_kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl = _Var3._M_head_impl;
            if (__ptr_01._M_head_impl !=
                (basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              Catch::clara::std::
              default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator()((default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_02,__ptr_01._M_head_impl);
            }
          }
        }
        else {
          this_01 = &this->partial_;
          (dat->partial_)._M_t.
          super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
          .
          super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
          ._M_head_impl =
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)0x0;
          __ptr_00._M_head_impl =
               (this_01->_M_t).
               super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
               .
               super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
               ._M_head_impl;
          (this_01->_M_t).
          super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
          .
          super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_false>
          ._M_head_impl = _Var2._M_head_impl;
          if (__ptr_00._M_head_impl !=
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x0) {
            Catch::clara::std::
            default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>
            ::operator()((default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>
                          *)this_01,__ptr_00._M_head_impl);
          }
        }
      }
      else {
        (dat->list_)._M_t.
        super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
        ._M_head_impl =
             (vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0;
        Catch::clara::std::
        __uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::reset((__uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&this->list_,__p_00);
      }
    }
    else {
      this_00 = &this->str_;
      (dat->str_)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      __ptr._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl = _Var1._M_head_impl;
      if (__ptr._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        Catch::clara::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,__ptr._M_head_impl);
      }
    }
  }
  else {
    (dat->obj_)._M_t.
    super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    .
    super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_*,_false>
    ._M_head_impl =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)0x0;
    Catch::clara::std::
    __uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)&this->obj_,__p);
  }
  dat->type_ = invalid;
  return;
}

Assistant:

basic_data(basic_data&& dat) : type_{dat.type_} {
        if (dat.obj_) {
            obj_ = std::move(dat.obj_);
        } else if (dat.str_) {
            str_ = std::move(dat.str_);
        } else if (dat.list_) {
            list_ = std::move(dat.list_);
        } else if (dat.partial_) {
            partial_ = std::move(dat.partial_);
        } else if (dat.lambda_) {
            lambda_ = std::move(dat.lambda_);
        }
        dat.type_ = type::invalid;
    }